

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safety_check.c
# Opt level: O3

void duckdb_je_safety_check_fail(char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buf [4096];
  __va_list_tag local_10d8;
  undefined1 local_10b8 [8];
  undefined8 local_10b0;
  undefined8 local_10a8;
  undefined8 local_10a0;
  undefined8 local_1098;
  undefined8 local_1090;
  undefined8 local_1088;
  undefined8 local_1078;
  undefined8 local_1068;
  undefined8 local_1058;
  undefined8 local_1048;
  undefined8 local_1038;
  undefined8 local_1028;
  undefined8 local_1018;
  char local_1008 [4104];
  
  local_10d8.reg_save_area = local_10b8;
  if (in_AL != '\0') {
    local_1088 = in_XMM0_Qa;
    local_1078 = in_XMM1_Qa;
    local_1068 = in_XMM2_Qa;
    local_1058 = in_XMM3_Qa;
    local_1048 = in_XMM4_Qa;
    local_1038 = in_XMM5_Qa;
    local_1028 = in_XMM6_Qa;
    local_1018 = in_XMM7_Qa;
  }
  local_10d8.overflow_arg_area = &ap[0].overflow_arg_area;
  local_10d8.gp_offset = 8;
  local_10d8.fp_offset = 0x30;
  local_10b0 = in_RSI;
  local_10a8 = in_RDX;
  local_10a0 = in_RCX;
  local_1098 = in_R8;
  local_1090 = in_R9;
  duckdb_je_malloc_vsnprintf(local_1008,0x1000,format,&local_10d8);
  if (safety_check_abort != (safety_check_abort_hook_t)0x0) {
    (*safety_check_abort)(local_1008);
    return;
  }
  duckdb_je_malloc_write(local_1008);
  abort();
}

Assistant:

void safety_check_fail(const char *format, ...) {
	char buf[MALLOC_PRINTF_BUFSIZE];

	va_list ap;
	va_start(ap, format);
	malloc_vsnprintf(buf, MALLOC_PRINTF_BUFSIZE, format, ap);
	va_end(ap);

	safety_check_detected_heap_corruption___run_address_sanitizer_build_to_debug(buf);
}